

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

Utf8CheckMode
google::protobuf::compiler::cpp::GetUtf8CheckMode(FieldDescriptor *field,Options *options)

{
  Syntax SVar1;
  FileOptions_OptimizeMode FVar2;
  FileDescriptor *pFVar3;
  Options *options_local;
  FieldDescriptor *field_local;
  
  pFVar3 = FieldDescriptor::file(field);
  SVar1 = FileDescriptor::syntax(pFVar3);
  if (SVar1 == SYNTAX_PROTO3) {
    field_local._4_4_ = STRICT;
  }
  else {
    pFVar3 = FieldDescriptor::file(field);
    FVar2 = GetOptimizeFor(pFVar3,options);
    if (FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      field_local._4_4_ = NONE;
    }
    else {
      field_local._4_4_ = VERIFY;
    }
  }
  return field_local._4_4_;
}

Assistant:

static Utf8CheckMode GetUtf8CheckMode(const FieldDescriptor* field,
                                      const Options& options) {
  if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    return STRICT;
  } else if (GetOptimizeFor(field->file(), options) !=
             FileOptions::LITE_RUNTIME) {
    return VERIFY;
  } else {
    return NONE;
  }
}